

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O1

bool cfd::core::WallyUtil::CheckValidMnemonic
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *mnemonic,string *language)

{
  int iVar1;
  words *w;
  string mnemonic_sentence;
  string local_58;
  string local_38;
  
  w = Bip39GetWordlist(language);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,&kMnemonicDelimiter,0x5e5c71);
  StringUtil::Join(&local_38,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)mnemonic,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  iVar1 = bip39_mnemonic_validate(w,local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return iVar1 == 0;
}

Assistant:

bool WallyUtil::CheckValidMnemonic(
    const std::vector<std::string>& mnemonic, const std::string& language) {
  words* wally_wordlist = Bip39GetWordlist(language);
  std::string mnemonic_sentence =
      StringUtil::Join(mnemonic, kMnemonicDelimiter);

  int ret = bip39_mnemonic_validate(wally_wordlist, mnemonic_sentence.c_str());
  if (ret != WALLY_OK) return false;
  return true;
}